

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O3

void __thiscall txrequest_tests::TxRequestTest::test_method(TxRequestTest *this)

{
  FastRandomContext *__urng;
  _func_int ***ppp_Var1;
  long lVar2;
  _Manager_type p_Var3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  _func_int **pp_Var8;
  undefined8 uVar9;
  _Invoker_type *pp_Var10;
  _Function_base *p_Var11;
  int iVar12;
  pointer ppVar13;
  ulong uVar14;
  function<void_()> *pfVar15;
  result_type_conflict rVar16;
  ulong uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  undefined8 uVar22;
  int iVar23;
  pointer ppVar24;
  long lVar25;
  _Manager_type *pp_Var26;
  _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
  *p_Var27;
  pointer in_RSI;
  pointer ppVar28;
  iterator in_R8;
  iterator pvVar29;
  iterator in_R9;
  iterator pvVar30;
  pointer ppVar31;
  char *pcVar32;
  pointer ppVar33;
  pointer ppVar34;
  pointer unaff_R15;
  ulong uVar35;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar36;
  size_t *local_1e8;
  char *local_1e0;
  undefined4 local_1d4;
  size_t local_1d0;
  undefined1 local_1c8 [24];
  _Manager_type local_1b0;
  _Invoker_type local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
  local_188;
  undefined4 *local_170;
  assertion_result local_168;
  undefined4 **local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  element_type *local_130;
  shared_count sStack_128;
  __distr_type __d;
  undefined1 *local_110;
  undefined1 local_f8 [16];
  Runner runner;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  __urng = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_rng;
  iVar23 = 0;
  do {
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar12 = 0;
    pcVar32 = (char *)0x0;
    ppVar24 = (pointer)0x0;
    ppVar33 = (pointer)0x0;
    ppVar28 = in_RSI;
    do {
      if ((pointer)pcVar32 == ppVar24) {
        ppVar34 = (pointer)((long)pcVar32 - (long)ppVar33);
        if (ppVar34 == (pointer)0x7fffffffffffffe0) goto LAB_006a5fb6;
        uVar35 = (long)ppVar34 >> 5;
        uVar17 = uVar35;
        if ((pointer)pcVar32 == ppVar33) {
          uVar17 = 1;
        }
        p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar17 + uVar35);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var27) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        if (CARRY8(uVar17,uVar35)) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        ppVar28 = (pointer)_GLOBAL__N_1::std::
                           _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ::_M_allocate(p_Var27,(size_t)ppVar28);
        *(TxRequestTest **)((long)ppVar28 + (long)ppVar34) = this;
        *(int *)((long)&ppVar28->second + (long)ppVar34) = iVar12;
        *(code **)((long)&(ppVar28->second).super__Function_base._M_manager + (long)ppVar34) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_invoke;
        *(code **)((long)((long)&(ppVar28->second).super__Function_base._M_functor + 8) +
                  (long)ppVar34) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_manager;
        ppVar31 = ppVar28;
        for (ppVar24 = ppVar33; (pointer)pcVar32 != ppVar24;
            ppVar24 = (pointer)&(ppVar24->second)._M_invoker) {
          *(_func_int ***)&((_Function_base *)&ppVar31->first)->_M_functor = (_func_int **)0x0;
          *(undefined8 *)&(ppVar31->second).super__Function_base._M_functor = 0;
          *(undefined8 *)((long)&(ppVar31->second).super__Function_base._M_functor + 8) = 0;
          (ppVar31->second).super__Function_base._M_manager =
               (ppVar24->second).super__Function_base._M_manager;
          lVar25 = *(long *)((long)&(ppVar24->second).super__Function_base._M_functor + 8);
          if (lVar25 != 0) {
            uVar22 = *(undefined8 *)&(ppVar24->second).super__Function_base._M_functor;
            *(_func_int ***)&((_Function_base *)&ppVar31->first)->_M_functor =
                 *(_func_int ***)&((_Function_base *)&ppVar24->first)->_M_functor;
            *(undefined8 *)&(ppVar31->second).super__Function_base._M_functor = uVar22;
            *(long *)((long)&(ppVar31->second).super__Function_base._M_functor + 8) = lVar25;
            *(undefined8 *)((long)&(ppVar24->second).super__Function_base._M_functor + 8) = 0;
            (ppVar24->second).super__Function_base._M_manager = (_Manager_type)0x0;
          }
          ppVar31 = (pointer)&(ppVar31->second)._M_invoker;
        }
        if (ppVar33 != (pointer)0x0) {
          operator_delete(ppVar33,(ulong)ppVar34);
        }
        ppVar24 = (pointer)((long)&ppVar28->first + (long)p_Var27 * 0x20);
      }
      else {
        *(undefined8 *)&(((pointer)pcVar32)->second).super__Function_base._M_functor = 0;
        *(TxRequestTest **)&((_Function_base *)&((pointer)pcVar32)->first)->_M_functor = this;
        *(int *)&(((pointer)pcVar32)->second).super__Function_base._M_functor = iVar12;
        (((pointer)pcVar32)->second).super__Function_base._M_manager =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_invoke;
        *(code **)((long)&(((pointer)pcVar32)->second).super__Function_base._M_functor + 8) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_manager;
        ppVar28 = ppVar33;
        ppVar31 = (pointer)pcVar32;
      }
      ppVar34 = (pointer)&(ppVar31->second)._M_invoker;
      if (ppVar34 == ppVar24) {
        ppVar33 = (pointer)((long)ppVar24 - (long)ppVar28);
        if (ppVar33 == (pointer)0x7fffffffffffffe0) goto LAB_006a5ff1;
        uVar35 = (long)ppVar33 >> 5;
        uVar17 = uVar35;
        if (ppVar24 == ppVar28) {
          uVar17 = 1;
        }
        p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar17 + uVar35);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var27) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        if (CARRY8(uVar17,uVar35)) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        ppVar13 = (pointer)_GLOBAL__N_1::std::
                           _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ::_M_allocate(p_Var27,(size_t)ppVar28);
        *(TxRequestTest **)((long)ppVar13 + (long)ppVar33) = this;
        *(int *)((long)&ppVar13->second + (long)ppVar33) = iVar12;
        *(code **)((long)&(ppVar13->second).super__Function_base._M_manager + (long)ppVar33) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_invoke;
        *(code **)((long)((long)&(ppVar13->second).super__Function_base._M_functor + 8) +
                  (long)ppVar33) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_manager;
        ppVar34 = ppVar13;
        if (ppVar24 != ppVar28) {
          pfVar15 = &ppVar28[-1].second;
          do {
            lVar25 = (long)(pfVar15 + 1);
            *(undefined8 *)&((_Function_base *)&ppVar34->first)->_M_functor = 0;
            *(undefined8 *)&(ppVar34->second).super__Function_base._M_functor = 0;
            *(_Manager_type *)((long)&(ppVar34->second).super__Function_base._M_functor + 8) =
                 (_Manager_type)0x0;
            (ppVar34->second).super__Function_base._M_manager =
                 *(_Manager_type *)((long)(pfVar15 + 1) + 0x18);
            p_Var3 = *(_Manager_type *)((long)(pfVar15 + 1) + 0x10);
            if (p_Var3 != (_Manager_type)0x0) {
              uVar22 = *(undefined8 *)((long)(pfVar15 + 1) + 8);
              *(undefined8 *)&((_Function_base *)&ppVar34->first)->_M_functor =
                   *(undefined8 *)lVar25;
              *(undefined8 *)&(ppVar34->second).super__Function_base._M_functor = uVar22;
              *(_Manager_type *)((long)&(ppVar34->second).super__Function_base._M_functor + 8) =
                   p_Var3;
              *(undefined8 *)((long)(pfVar15 + 1) + 0x10) = 0;
              *(undefined8 *)((long)(pfVar15 + 1) + 0x18) = 0;
            }
            ppVar34 = (pointer)&(ppVar34->second)._M_invoker;
            pfVar15 = (function<void_()> *)lVar25;
          } while ((pointer)lVar25 != ppVar31);
        }
        if (ppVar28 != (pointer)0x0) {
          operator_delete(ppVar28,(ulong)ppVar33);
        }
        ppVar34 = (pointer)&(ppVar34->second)._M_invoker;
        ppVar24 = (pointer)((long)&ppVar13->first + (long)p_Var27 * 0x20);
      }
      else {
        ppVar31[1].first.__r = 0;
        (ppVar31->second)._M_invoker = (_Invoker_type)this;
        *(int *)&ppVar31[1].first.__r = iVar12;
        *(code **)((long)&ppVar31[1].second.super__Function_base._M_functor + 8) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_invoke;
        *(code **)&ppVar31[1].second.super__Function_base._M_functor =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_manager;
        ppVar34 = (pointer)&ppVar31[1].second.super__Function_base._M_manager;
        ppVar13 = ppVar28;
        ppVar31 = ppVar34;
      }
      ppVar28 = ppVar13;
      if (ppVar34 == ppVar24) {
        uVar17 = (long)ppVar24 - (long)ppVar13;
        if (uVar17 == 0x7fffffffffffffe0) goto LAB_006a602c;
        uVar14 = (long)uVar17 >> 5;
        uVar35 = uVar14;
        if (ppVar24 == ppVar13) {
          uVar35 = 1;
        }
        p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar35 + uVar14);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var27) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        if (CARRY8(uVar35,uVar14)) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        ppVar28 = (pointer)_GLOBAL__N_1::std::
                           _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ::_M_allocate(p_Var27,(size_t)ppVar13);
        *(TxRequestTest **)((long)ppVar28 + uVar17) = this;
        *(int *)((long)ppVar28 + uVar17 + 8) = iVar12;
        *(code **)((long)ppVar28 + uVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_invoke;
        *(code **)((long)ppVar28 + uVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_manager;
        ppVar34 = ppVar28;
        for (ppVar31 = ppVar13; ppVar24 != ppVar31; ppVar31 = (pointer)&(ppVar31->second)._M_invoker
            ) {
          *(_func_int ***)&((_Function_base *)&ppVar34->first)->_M_functor = (_func_int **)0x0;
          *(undefined8 *)&(ppVar34->second).super__Function_base._M_functor = 0;
          *(undefined8 *)((long)&(ppVar34->second).super__Function_base._M_functor + 8) = 0;
          (ppVar34->second).super__Function_base._M_manager =
               (ppVar31->second).super__Function_base._M_manager;
          lVar25 = *(long *)((long)&(ppVar31->second).super__Function_base._M_functor + 8);
          if (lVar25 != 0) {
            uVar22 = *(undefined8 *)&(ppVar31->second).super__Function_base._M_functor;
            *(_func_int ***)&((_Function_base *)&ppVar34->first)->_M_functor =
                 *(_func_int ***)&((_Function_base *)&ppVar31->first)->_M_functor;
            *(undefined8 *)&(ppVar34->second).super__Function_base._M_functor = uVar22;
            *(long *)((long)&(ppVar34->second).super__Function_base._M_functor + 8) = lVar25;
            *(undefined8 *)((long)&(ppVar31->second).super__Function_base._M_functor + 8) = 0;
            (ppVar31->second).super__Function_base._M_manager = (_Manager_type)0x0;
          }
          ppVar34 = (pointer)&(ppVar34->second)._M_invoker;
        }
        if (ppVar13 != (pointer)0x0) {
          operator_delete(ppVar13,uVar17);
          ppVar33 = ppVar28;
        }
        ppVar24 = (pointer)((long)&ppVar28->first + (long)p_Var27 * 0x20);
      }
      else {
        *(undefined8 *)&(ppVar34->second).super__Function_base._M_functor = 0;
        *(TxRequestTest **)&((_Function_base *)&ppVar34->first)->_M_functor = this;
        *(int *)&(ppVar34->second).super__Function_base._M_functor = iVar12;
        (ppVar34->second).super__Function_base._M_manager =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_invoke;
        *(code **)((long)&(ppVar34->second).super__Function_base._M_functor + 8) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_manager;
      }
      ppVar31 = (pointer)&(ppVar34->second)._M_invoker;
      if (ppVar31 == ppVar24) {
        uVar17 = (long)ppVar24 - (long)ppVar28;
        if (uVar17 == 0x7fffffffffffffe0) goto LAB_006a6067;
        uVar14 = (long)uVar17 >> 5;
        uVar35 = uVar14;
        if (ppVar24 == ppVar28) {
          uVar35 = 1;
        }
        p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar35 + uVar14);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var27) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        if (CARRY8(uVar35,uVar14)) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        ppVar13 = (pointer)_GLOBAL__N_1::std::
                           _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ::_M_allocate(p_Var27,(size_t)ppVar28);
        *(TxRequestTest **)((long)ppVar13 + uVar17) = this;
        *(int *)((long)ppVar13 + uVar17 + 8) = iVar12;
        *(code **)((long)ppVar13 + uVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_invoke;
        *(code **)((long)ppVar13 + uVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_manager;
        ppVar33 = ppVar13;
        if (ppVar24 != ppVar28) {
          pfVar15 = &ppVar28[-1].second;
          do {
            lVar25 = (long)(pfVar15 + 1);
            *(undefined8 *)&((_Function_base *)&ppVar33->first)->_M_functor = 0;
            *(undefined8 *)&(ppVar33->second).super__Function_base._M_functor = 0;
            *(_Manager_type *)((long)&(ppVar33->second).super__Function_base._M_functor + 8) =
                 (_Manager_type)0x0;
            (ppVar33->second).super__Function_base._M_manager =
                 *(_Manager_type *)((long)(pfVar15 + 1) + 0x18);
            p_Var3 = *(_Manager_type *)((long)(pfVar15 + 1) + 0x10);
            if (p_Var3 != (_Manager_type)0x0) {
              uVar22 = *(undefined8 *)((long)(pfVar15 + 1) + 8);
              *(undefined8 *)&((_Function_base *)&ppVar33->first)->_M_functor =
                   *(undefined8 *)lVar25;
              *(undefined8 *)&(ppVar33->second).super__Function_base._M_functor = uVar22;
              *(_Manager_type *)((long)&(ppVar33->second).super__Function_base._M_functor + 8) =
                   p_Var3;
              *(undefined8 *)((long)(pfVar15 + 1) + 0x10) = 0;
              *(undefined8 *)((long)(pfVar15 + 1) + 0x18) = 0;
            }
            ppVar33 = (pointer)&(ppVar33->second)._M_invoker;
            pfVar15 = (function<void_()> *)lVar25;
          } while ((pointer)lVar25 != ppVar34);
        }
        if (ppVar28 != (pointer)0x0) {
          operator_delete(ppVar28,uVar17);
        }
        ppVar31 = (pointer)&(ppVar33->second)._M_invoker;
        ppVar24 = (pointer)((long)&ppVar13->first + (long)p_Var27 * 0x20);
      }
      else {
        ppVar34[1].first.__r = 0;
        (ppVar34->second)._M_invoker = (_Invoker_type)this;
        *(int *)&ppVar34[1].first.__r = iVar12;
        *(code **)((long)&ppVar34[1].second.super__Function_base._M_functor + 8) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_invoke;
        *(code **)&ppVar34[1].second.super__Function_base._M_functor =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_manager;
        ppVar34 = (pointer)&ppVar34[1].second.super__Function_base._M_manager;
        ppVar13 = ppVar28;
        ppVar28 = ppVar33;
        ppVar31 = ppVar34;
      }
      unaff_R15 = ppVar13;
      if (ppVar31 == ppVar24) {
        ppVar33 = (pointer)((long)ppVar24 - (long)ppVar13);
        if (ppVar33 == (pointer)0x7fffffffffffffe0) goto LAB_006a60a2;
        uVar35 = (long)ppVar33 >> 5;
        uVar17 = uVar35;
        if (ppVar24 == ppVar13) {
          uVar17 = 1;
        }
        p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar17 + uVar35);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var27) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        if (CARRY8(uVar17,uVar35)) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        ppVar28 = (pointer)_GLOBAL__N_1::std::
                           _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ::_M_allocate(p_Var27,(size_t)ppVar13);
        *(TxRequestTest **)((long)ppVar28 + (long)ppVar33) = this;
        *(int *)((long)&ppVar28->second + (long)ppVar33) = iVar12;
        *(code **)((long)&(ppVar28->second).super__Function_base._M_manager + (long)ppVar33) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_invoke;
        *(code **)((long)((long)&(ppVar28->second).super__Function_base._M_functor + 8) +
                  (long)ppVar33) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_manager;
        ppVar31 = ppVar28;
        for (ppVar34 = ppVar13; ppVar24 != ppVar34; ppVar34 = (pointer)&(ppVar34->second)._M_invoker
            ) {
          *(_func_int ***)&((_Function_base *)&ppVar31->first)->_M_functor = (_func_int **)0x0;
          *(undefined8 *)&(ppVar31->second).super__Function_base._M_functor = 0;
          *(undefined8 *)((long)&(ppVar31->second).super__Function_base._M_functor + 8) = 0;
          (ppVar31->second).super__Function_base._M_manager =
               (ppVar34->second).super__Function_base._M_manager;
          lVar25 = *(long *)((long)&(ppVar34->second).super__Function_base._M_functor + 8);
          if (lVar25 != 0) {
            uVar22 = *(undefined8 *)&(ppVar34->second).super__Function_base._M_functor;
            *(_func_int ***)&((_Function_base *)&ppVar31->first)->_M_functor =
                 *(_func_int ***)&((_Function_base *)&ppVar34->first)->_M_functor;
            *(undefined8 *)&(ppVar31->second).super__Function_base._M_functor = uVar22;
            *(long *)((long)&(ppVar31->second).super__Function_base._M_functor + 8) = lVar25;
            *(undefined8 *)((long)&(ppVar34->second).super__Function_base._M_functor + 8) = 0;
            (ppVar34->second).super__Function_base._M_manager = (_Manager_type)0x0;
          }
          ppVar31 = (pointer)&(ppVar31->second)._M_invoker;
        }
        if (ppVar13 != (pointer)0x0) {
          operator_delete(ppVar13,(ulong)ppVar33);
          unaff_R15 = ppVar33;
        }
        ppVar24 = (pointer)((long)&ppVar28->first + (long)p_Var27 * 0x20);
      }
      else {
        *(undefined8 *)&(ppVar31->second).super__Function_base._M_functor = 0;
        *(TxRequestTest **)&((_Function_base *)&ppVar31->first)->_M_functor = this;
        *(int *)&(ppVar31->second).super__Function_base._M_functor = iVar12;
        (ppVar31->second).super__Function_base._M_manager =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_invoke;
        *(code **)((long)&(ppVar31->second).super__Function_base._M_functor + 8) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_manager;
        ppVar28 = ppVar13;
      }
      ppVar34 = (pointer)&(ppVar31->second)._M_invoker;
      if (ppVar34 == ppVar24) {
        uVar17 = (long)ppVar24 - (long)ppVar28;
        if (uVar17 == 0x7fffffffffffffe0) goto LAB_006a60dd;
        uVar14 = (long)uVar17 >> 5;
        uVar35 = uVar14;
        if (ppVar24 == ppVar28) {
          uVar35 = 1;
        }
        p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar35 + uVar14);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var27) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        if (CARRY8(uVar35,uVar14)) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        unaff_R15 = (pointer)_GLOBAL__N_1::std::
                             _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                             ::_M_allocate(p_Var27,(size_t)unaff_R15);
        *(undefined8 *)((long)unaff_R15 + uVar17 + 8) = 0;
        *(TxRequestTest **)((long)unaff_R15 + uVar17) = this;
        *(code **)((long)unaff_R15 + uVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_invoke;
        *(code **)((long)unaff_R15 + uVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_manager;
        ppVar33 = unaff_R15;
        if (ppVar24 != ppVar28) {
          pfVar15 = &ppVar28[-1].second;
          do {
            lVar25 = (long)(pfVar15 + 1);
            *(undefined8 *)&((_Function_base *)&ppVar33->first)->_M_functor = 0;
            *(undefined8 *)&(ppVar33->second).super__Function_base._M_functor = 0;
            *(_Manager_type *)((long)&(ppVar33->second).super__Function_base._M_functor + 8) =
                 (_Manager_type)0x0;
            (ppVar33->second).super__Function_base._M_manager =
                 *(_Manager_type *)((long)(pfVar15 + 1) + 0x18);
            p_Var3 = *(_Manager_type *)((long)(pfVar15 + 1) + 0x10);
            if (p_Var3 != (_Manager_type)0x0) {
              uVar22 = *(undefined8 *)((long)(pfVar15 + 1) + 8);
              *(undefined8 *)&((_Function_base *)&ppVar33->first)->_M_functor =
                   *(undefined8 *)lVar25;
              *(undefined8 *)&(ppVar33->second).super__Function_base._M_functor = uVar22;
              *(_Manager_type *)((long)&(ppVar33->second).super__Function_base._M_functor + 8) =
                   p_Var3;
              *(undefined8 *)((long)(pfVar15 + 1) + 0x10) = 0;
              *(undefined8 *)((long)(pfVar15 + 1) + 0x18) = 0;
            }
            ppVar33 = (pointer)&(ppVar33->second)._M_invoker;
            pfVar15 = (function<void_()> *)lVar25;
          } while ((pointer)lVar25 != ppVar31);
        }
        if (ppVar28 != (pointer)0x0) {
          operator_delete(ppVar28,uVar17);
        }
        ppVar34 = (pointer)&(ppVar33->second)._M_invoker;
        ppVar24 = (pointer)((long)&unaff_R15->first + (long)p_Var27 * 0x20);
      }
      else {
        ppVar31[1].first.__r = 0;
        (ppVar31->second)._M_invoker = (_Invoker_type)this;
        *(code **)((long)&ppVar31[1].second.super__Function_base._M_functor + 8) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_invoke;
        *(code **)&ppVar31[1].second.super__Function_base._M_functor =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_manager;
        ppVar34 = (pointer)&ppVar31[1].second.super__Function_base._M_manager;
        unaff_R15 = ppVar28;
        ppVar31 = ppVar34;
      }
      ppVar28 = unaff_R15;
      if (ppVar34 == ppVar24) {
        ppVar31 = (pointer)((long)ppVar24 - (long)unaff_R15);
        if (ppVar31 == (pointer)0x7fffffffffffffe0) goto LAB_006a6118;
        uVar35 = (long)ppVar31 >> 5;
        uVar17 = uVar35;
        if (ppVar24 == unaff_R15) {
          uVar17 = 1;
        }
        p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar17 + uVar35);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var27) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        if (CARRY8(uVar17,uVar35)) {
          p_Var27 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        ppVar33 = (pointer)_GLOBAL__N_1::std::
                           _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ::_M_allocate(p_Var27,(size_t)unaff_R15);
        *(undefined8 *)((long)&ppVar33->second + (long)ppVar31) = 0;
        *(TxRequestTest **)((long)ppVar33 + (long)ppVar31) = this;
        *(code **)((long)&(ppVar33->second).super__Function_base._M_manager + (long)ppVar31) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_invoke;
        *(code **)((long)((long)&(ppVar33->second).super__Function_base._M_functor + 8) +
                  (long)ppVar31) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_manager;
        ppVar34 = ppVar33;
        for (ppVar13 = unaff_R15; ppVar24 != ppVar13;
            ppVar13 = (pointer)&(ppVar13->second)._M_invoker) {
          *(_func_int ***)&((_Function_base *)&ppVar34->first)->_M_functor = (_func_int **)0x0;
          *(undefined8 *)&(ppVar34->second).super__Function_base._M_functor = 0;
          *(undefined8 *)((long)&(ppVar34->second).super__Function_base._M_functor + 8) = 0;
          (ppVar34->second).super__Function_base._M_manager =
               (ppVar13->second).super__Function_base._M_manager;
          lVar25 = *(long *)((long)&(ppVar13->second).super__Function_base._M_functor + 8);
          if (lVar25 != 0) {
            uVar22 = *(undefined8 *)&(ppVar13->second).super__Function_base._M_functor;
            *(_func_int ***)&((_Function_base *)&ppVar34->first)->_M_functor =
                 *(_func_int ***)&((_Function_base *)&ppVar13->first)->_M_functor;
            *(undefined8 *)&(ppVar34->second).super__Function_base._M_functor = uVar22;
            *(long *)((long)&(ppVar34->second).super__Function_base._M_functor + 8) = lVar25;
            *(undefined8 *)((long)&(ppVar13->second).super__Function_base._M_functor + 8) = 0;
            (ppVar13->second).super__Function_base._M_manager = (_Manager_type)0x0;
          }
          ppVar34 = (pointer)&(ppVar34->second)._M_invoker;
        }
        if (unaff_R15 != (pointer)0x0) {
          operator_delete(unaff_R15,(ulong)ppVar31);
          ppVar28 = ppVar31;
        }
        ppVar24 = (pointer)((long)&ppVar33->first + (long)p_Var27 * 0x20);
      }
      else {
        *(undefined8 *)&(ppVar34->second).super__Function_base._M_functor = 0;
        *(TxRequestTest **)&((_Function_base *)&ppVar34->first)->_M_functor = this;
        (ppVar34->second).super__Function_base._M_manager =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_invoke;
        *(code **)((long)&(ppVar34->second).super__Function_base._M_functor + 8) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_manager;
        ppVar33 = unaff_R15;
        unaff_R15 = ppVar31;
      }
      pcVar32 = (char *)&(ppVar34->second)._M_invoker;
      iVar12 = iVar12 + 1;
    } while (iVar12 != 0x40);
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar33;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar32;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar24;
    if (ppVar33 != (pointer)pcVar32) {
      if ((ulong)((long)pcVar32 - (long)ppVar33) < 0x1fffffffe1) {
        pp_Var26 = (_Manager_type *)&(ppVar33->second)._M_invoker;
        if (((long)pcVar32 - (long)ppVar33 & 0x20U) == 0) {
          __d._M_param._M_a = 0;
          __d._M_param._M_b = 1;
          rVar16 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&__d,__urng,
                              (param_type *)&__d);
          runner.txrequest.m_impl._M_t.
          super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
          .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
               (unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>)
               *pp_Var26;
          runner.actions.
          super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar33[1].first.__r;
          ppp_Var1 = (_func_int ***)((long)&ppVar33->first + rVar16 * 0x20);
          uVar22 = ppp_Var1[1];
          *pp_Var26 = (_Manager_type)*ppp_Var1;
          ppVar33[1].first.__r = uVar22;
          pp_Var26 = &ppVar33[1].second.super__Function_base._M_manager;
          ppp_Var1 = (_func_int ***)((long)&ppVar33->first + rVar16 * 0x20);
          *ppp_Var1 = (_func_int **)
                      runner.txrequest.m_impl._M_t.
                      super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
                      .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl;
          ppp_Var1[1] = (_func_int **)
                        runner.actions.
                        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          uVar22 = *(undefined8 *)&ppVar33[1].second.super__Function_base._M_functor;
          p_Var3 = *(_Manager_type *)((long)&ppVar33[1].second.super__Function_base._M_functor + 8);
          p_Var11 = &(&ppVar33->second)[rVar16].super__Function_base;
          uVar5 = *(undefined4 *)((long)&p_Var11->_M_functor + 0xc);
          uVar6 = *(undefined4 *)&p_Var11->_M_manager;
          uVar7 = *(undefined4 *)((long)&p_Var11->_M_manager + 4);
          *(undefined4 *)&ppVar33[1].second.super__Function_base._M_functor =
               *(undefined4 *)((long)&p_Var11->_M_functor + 8);
          *(undefined4 *)((long)&ppVar33[1].second.super__Function_base._M_functor + 4) = uVar5;
          *(undefined4 *)((long)&ppVar33[1].second.super__Function_base._M_functor + 8) = uVar6;
          *(undefined4 *)((long)&ppVar33[1].second.super__Function_base._M_functor + 0xc) = uVar7;
          p_Var11 = &(&ppVar33->second)[rVar16].super__Function_base;
          *(undefined8 *)((long)&p_Var11->_M_functor + 8) = uVar22;
          p_Var11->_M_manager = p_Var3;
        }
        if (pp_Var26 != (_Manager_type *)pcVar32) {
          lVar25 = (long)pp_Var26 - (long)ppVar33;
          do {
            uVar35 = (lVar25 >> 5) + 2;
            runner.actions.
            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)(((lVar25 >> 5) + 1) * uVar35 + -1)
            ;
            runner.txrequest.m_impl._M_t.
            super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
            .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
                 (unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>)
                 (__uniq_ptr_data<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>,_true,_true>
                  )0x0;
            rVar16 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&runner,__urng,
                                (param_type *)&runner);
            uVar17 = rVar16 / uVar35;
            uVar35 = rVar16 % uVar35;
            pp_Var8 = (_func_int **)*pp_Var26;
            uVar22 = pp_Var26[1];
            ppp_Var1 = (_func_int ***)((long)&ppVar33->first + uVar17 * 0x20);
            uVar9 = ppp_Var1[1];
            *pp_Var26 = (_Manager_type)*ppp_Var1;
            pp_Var26[1] = (_Manager_type)uVar9;
            ppp_Var1 = (_func_int ***)((long)&ppVar33->first + uVar17 * 0x20);
            *ppp_Var1 = pp_Var8;
            ppp_Var1[1] = (_func_int **)uVar22;
            uVar22 = pp_Var26[2];
            pp_Var26[2] = (_Manager_type)
                          *(undefined8 *)
                           ((long)&(&ppVar33->second)[uVar17].super__Function_base._M_functor + 8);
            *(undefined8 *)((long)&(&ppVar33->second)[uVar17].super__Function_base._M_functor + 8) =
                 uVar22;
            p_Var3 = pp_Var26[3];
            pp_Var26[3] = (&ppVar33->second)[uVar17].super__Function_base._M_manager;
            (&ppVar33->second)[uVar17].super__Function_base._M_manager = p_Var3;
            runner.txrequest.m_impl._M_t.
            super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
            .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
                 (unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>)
                 pp_Var26[4];
            runner.actions.
            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pp_Var26[5];
            ppp_Var1 = (_func_int ***)((long)&ppVar33->first + uVar35 * 0x20);
            uVar22 = ppp_Var1[1];
            pp_Var26[4] = (_Manager_type)*ppp_Var1;
            pp_Var26[5] = (_Manager_type)uVar22;
            ppp_Var1 = (_func_int ***)((long)&ppVar33->first + uVar35 * 0x20);
            *ppp_Var1 = (_func_int **)
                        runner.txrequest.m_impl._M_t.
                        super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
                        .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl;
            ppp_Var1[1] = (_func_int **)
                          runner.actions.
                          super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            uVar22 = pp_Var26[6];
            pp_Var26[6] = (_Manager_type)
                          *(undefined8 *)
                           ((long)&(&ppVar33->second)[uVar35].super__Function_base._M_functor + 8);
            *(undefined8 *)((long)&(&ppVar33->second)[uVar35].super__Function_base._M_functor + 8) =
                 uVar22;
            p_Var3 = pp_Var26[7];
            pp_Var26[7] = (&ppVar33->second)[uVar35].super__Function_base._M_manager;
            (&ppVar33->second)[uVar35].super__Function_base._M_manager = p_Var3;
            lVar25 = lVar25 + 0x40;
            pp_Var26 = pp_Var26 + 8;
          } while (pp_Var26 != (_Manager_type *)pcVar32);
        }
      }
      else {
        __d._M_param._M_a = 0;
        __d._M_param._M_b = 0xffffffffffffffff;
        if (ppVar33 != ppVar34) {
          lVar25 = 0x20;
          ppVar24 = ppVar33;
          do {
            local_168.m_message.px = (element_type *)(lVar25 >> 5);
            local_168._0_8_ = (undefined **)0x0;
            rVar16 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&__d,__urng,
                                (param_type *)&local_168);
            pp_Var10 = &(ppVar24->second)._M_invoker;
            runner.txrequest.m_impl._M_t.
            super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
            .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
                 (unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>)
                 *pp_Var10;
            runner.actions.
            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar24[1].first.__r;
            ppp_Var1 = (_func_int ***)((long)&ppVar33->first + rVar16 * 0x20);
            uVar22 = ppp_Var1[1];
            *pp_Var10 = (_Invoker_type)*ppp_Var1;
            ppVar24[1].first.__r = uVar22;
            ppp_Var1 = (_func_int ***)((long)&ppVar33->first + rVar16 * 0x20);
            *ppp_Var1 = (_func_int **)
                        runner.txrequest.m_impl._M_t.
                        super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
                        .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl;
            ppp_Var1[1] = (_func_int **)
                          runner.actions.
                          super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            uVar22 = *(undefined8 *)&ppVar24[1].second.super__Function_base._M_functor;
            *(undefined8 *)&ppVar24[1].second.super__Function_base._M_functor =
                 *(undefined8 *)
                  ((long)&(&ppVar33->second)[rVar16].super__Function_base._M_functor + 8);
            *(undefined8 *)((long)&(&ppVar33->second)[rVar16].super__Function_base._M_functor + 8) =
                 uVar22;
            p_Var3 = *(_Manager_type *)
                      ((long)&ppVar24[1].second.super__Function_base._M_functor + 8);
            *(_Manager_type *)((long)&ppVar24[1].second.super__Function_base._M_functor + 8) =
                 (&ppVar33->second)[rVar16].super__Function_base._M_manager;
            (&ppVar33->second)[rVar16].super__Function_base._M_manager = p_Var3;
            lVar25 = lVar25 + 0x20;
            ppVar24 = (pointer)pp_Var10;
          } while ((pointer)pp_Var10 != ppVar34);
        }
      }
    }
    TxRequestTracker::TxRequestTracker(&runner.txrequest,false);
    runner.actions.
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    runner.actions.
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    runner.actions.
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runner.expired._M_t._M_impl.super__Rb_tree_header._M_header;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar18 = RandomMixin<FastRandomContext>::randbits
                       (&__urng->super_RandomMixin<FastRandomContext>,0x2d);
    if ((pointer)local_188.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish != ppVar33) {
      do {
        ppVar24 = (pointer)local_188.
                           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
        uVar19 = RandomMixin<FastRandomContext>::randbits
                           (&__urng->super_RandomMixin<FastRandomContext>,0x17);
        uVar20 = RandomMixin<FastRandomContext>::randbits
                           (&__urng->super_RandomMixin<FastRandomContext>,0x17);
        ppVar28 = (pointer)0x17;
        uVar21 = RandomMixin<FastRandomContext>::randbits
                           (&__urng->super_RandomMixin<FastRandomContext>,0x17);
        pcVar32 = (char *)(uVar19 + uVar18 + 4);
        local_110 = (((_Function_base *)&((pointer)pcVar32)->first)->_M_functor)._M_pod_data +
                    uVar21 + uVar20;
        __d._M_param._M_b = (unsigned_long)&runner;
        local_f8[0] = 0;
        __d._M_param._M_a = (unsigned_long)__urng;
        if (ppVar24 != ppVar33) {
          ppVar34 = (pointer)0x0;
          do {
            if (ppVar24[-1].second.super__Function_base._M_manager == (_Manager_type)0x0) {
              local_188.
              super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppVar24;
              if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_006a637d;
              ppVar24 = (pointer)local_f8;
              std::__throw_bad_function_call();
              unaff_R15 = (pointer)__urng;
              goto LAB_006a5f9a;
            }
            pcVar32 = (char *)&ppVar24[-1].second;
            ppVar28 = (pointer)&__d;
            (*ppVar24[-1].second._M_invoker)((_Any_data *)pcVar32);
            p_Var3 = ppVar24[-1].second.super__Function_base._M_manager;
            if (p_Var3 != (_Manager_type)0x0) {
              ppVar28 = (pointer)pcVar32;
              (*p_Var3)((_Any_data *)pcVar32,(_Any_data *)pcVar32,__destroy_functor);
            }
            ppVar24 = (pointer)pcVar32;
          } while (((pointer)pcVar32 != ppVar33) &&
                  (uVar4 = (uint)ppVar34, ppVar34 = (pointer)(ulong)(uVar4 + 1), uVar4 < 9));
        }
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppVar24;
      } while ((pointer)local_188.
                        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish != ppVar33);
    }
    ppVar28 = runner.actions.
              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    unaff_R15 = runner.actions.
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    in_RSI = (pointer)&__d;
    pcVar32 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    ppVar33 = (pointer)0xf4708f;
    if (runner.actions.
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        runner.actions.
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar25 = ((long)runner.actions.
                      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)runner.actions.
                      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      _GLOBAL__N_1::std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                           *)in_RSI,
                          (__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>
                           )runner.actions.
                            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (lVar25 - (lVar25 + 1 >> 0x3f)) + 1 >> 1);
      if (local_110 == (char *)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::TxRequestTest::TestInterleavedScenarios()::__7>>
                  (unaff_R15);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>>,std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::TxRequestTest::TestInterleavedScenarios()::__7>>
                  (unaff_R15,ppVar28,local_110,__d._M_param._M_b);
      }
      _GLOBAL__N_1::std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                  *)in_RSI);
      ppVar34 = runner.actions.
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar24 = runner.actions.
                     super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar24 != ppVar34;
          ppVar24 = ppVar24 + 1) {
        if ((ppVar24->second).super__Function_base._M_manager == (_Manager_type)0x0)
        goto LAB_006a5f9a;
        (*(ppVar24->second)._M_invoker)((_Any_data *)&ppVar24->second);
      }
    }
    local_198 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_190 = "";
    local_1a8 = (_Invoker_type)&boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x2e5;
    file.m_begin = (iterator)&local_198;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
    local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
    local_1c8._0_8_ = &PTR__lazy_ostream_01388f08;
    local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1b0 = (_Manager_type)0xf4aea1;
    local_1d0 = TxRequestTracker::Size(&runner.txrequest);
    local_1d4 = 0;
    local_138 = (undefined1 *)CONCAT71(local_138._1_7_,local_1d0 == 0);
    local_130 = (element_type *)0x0;
    sStack_128.pi_ = (sp_counted_base *)0x0;
    local_148 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_140 = "";
    local_1e8 = &local_1d0;
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01388f48;
    local_170 = &local_1d4;
    local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
    local_168._0_8_ = &PTR__lazy_ostream_01388f88;
    local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_150 = &local_170;
    unaff_R15 = (pointer)local_1c8;
    pvVar29 = (iterator)0x1;
    pvVar30 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_138,(lazy_ostream *)unaff_R15,1,2,REQUIRE,0xf4709e,
               (size_t)&local_148,0x2e5,in_RSI,"0U",&local_168);
    boost::detail::shared_count::~shared_count(&sStack_128);
    local_1c8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_1c8._8_8_ = "";
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    local_130 = (element_type *)&boost::unit_test::basic_cstring<char_const>::null;
    _cVar36 = 0x6a5e36;
    file_00.m_end = (iterator)0x2e6;
    file_00.m_begin = (iterator)unaff_R15;
    msg_00.m_end = pvVar30;
    msg_00.m_begin = pvVar29;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_138,
               msg_00);
    local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (runner.expired._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
    local_168.m_message.px = (element_type *)0x0;
    local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148 = "runner.expired.empty()";
    local_140 = "";
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01389048;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_1e8 = (size_t *)0xf47027;
    local_1e0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_168,(lazy_ostream *)in_RSI,1,0,WARN,_cVar36,(size_t)&local_1e8,0x2e6);
    boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
    _GLOBAL__N_1::std::
    _Rb_tree<std::pair<long,_GenTxid>,_std::pair<long,_GenTxid>,_std::_Identity<std::pair<long,_GenTxid>_>,_std::less<std::pair<long,_GenTxid>_>,_std::allocator<std::pair<long,_GenTxid>_>_>
    ::~_Rb_tree(&runner.expired._M_t);
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                 *)&runner.txhashset);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
              &runner.peerset);
    _GLOBAL__N_1::std::
    vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ::~vector(&runner.actions);
    TxRequestTracker::~TxRequestTracker(&runner.txrequest);
    _GLOBAL__N_1::std::
    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ::~vector(&local_188);
    iVar23 = iVar23 + 1;
  } while (iVar23 != 5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_006a637d:
  __stack_chk_fail();
LAB_006a5f9a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    std::__throw_bad_function_call();
LAB_006a5fb6:
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar33;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar32;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar24;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      std::__throw_length_error("vector::_M_realloc_insert");
      ppVar31 = unaff_R15;
LAB_006a5ff1:
      local_188.
      super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar28;
      local_188.
      super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppVar34;
      local_188.
      super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar24;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_length_error("vector::_M_realloc_insert");
LAB_006a602c:
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar28;
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppVar34;
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar24;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          std::__throw_length_error("vector::_M_realloc_insert");
LAB_006a6067:
          local_188.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar28;
          local_188.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppVar31;
          local_188.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar24;
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            std::__throw_length_error("vector::_M_realloc_insert");
            unaff_R15 = ppVar28;
            ppVar28 = ppVar33;
LAB_006a60a2:
            local_188.
            super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)unaff_R15;
            local_188.
            super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppVar31;
            local_188.
            super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar24;
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              local_188.
              super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)unaff_R15;
              std::__throw_length_error("vector::_M_realloc_insert");
LAB_006a60dd:
              local_188.
              super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar28;
              local_188.
              super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppVar34;
              local_188.
              super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar24;
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                std::__throw_length_error("vector::_M_realloc_insert");
LAB_006a6118:
                local_188.
                super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)unaff_R15;
                local_188.
                super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppVar34;
                local_188.
                super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar24;
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                  uVar22 = std::__throw_length_error("vector::_M_realloc_insert");
                  _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::~vector(&local_188);
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                    _Unwind_Resume(uVar22);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_006a637d;
}

Assistant:

BOOST_AUTO_TEST_CASE(TxRequestTest)
{
    for (int i = 0; i < 5; ++i) {
        TestInterleavedScenarios();
    }
}